

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall
lest::unexpected::unexpected(unexpected *this,location *where_,text *expr_,text *note_)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  text local_b8;
  location local_98;
  text local_70;
  text local_50;
  
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"failed: got unexpected exception","");
  if (local_d8 == &local_c8) {
    local_b8.field_2._8_4_ = local_c8._8_4_;
    local_b8.field_2._12_4_ = local_c8._12_4_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)local_d8;
  }
  local_b8._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity._0_4_ = local_c8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_98.file._M_dataplus._M_p = (pointer)&local_98.file.field_2;
  pcVar1 = (where_->file)._M_dataplus._M_p;
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (where_->file)._M_string_length);
  local_98.line = where_->line;
  pcVar1 = (expr_->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + expr_->_M_string_length);
  pcVar1 = (note_->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + note_->_M_string_length);
  message::message(&this->super_message,&local_b8,&local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.file._M_dataplus._M_p != &local_98.file.field_2) {
    operator_delete(local_98.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  *(undefined ***)&this->super_message = &PTR__message_001f7b90;
  return;
}

Assistant:

unexpected( location where_, text expr_, text note_ = "" )
    : message( "failed: got unexpected exception", where_, expr_, note_) {}